

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# d1_both.cc
# Opt level: O3

ssl_open_record_t __thiscall
bssl::dtls1_open_change_cipher_spec
          (bssl *this,SSL *ssl,size_t *out_consumed,uint8_t *out_alert,Span<unsigned_char> in)

{
  ushort uVar1;
  ssl_open_record_t sVar2;
  ushort *puVar3;
  bool bVar4;
  Span<unsigned_char> in_00;
  
  in_00.data_ = in.data_;
  puVar3 = *(ushort **)(this + 0x38);
  uVar1 = *puVar3;
  if ((uVar1 & 1) == 0) {
    in_00.size_._0_2_ = uVar1;
    in_00.size_._2_6_ = 0;
    sVar2 = dtls1_open_handshake(this,ssl,out_consumed,out_alert,in_00);
    if (sVar2 != ssl_open_record_success) {
      return sVar2;
    }
    puVar3 = *(ushort **)(this + 0x38);
    uVar1 = *puVar3;
  }
  bVar4 = (uVar1 & 1) != 0;
  if (bVar4) {
    *puVar3 = uVar1 & 0xfffe;
  }
  return (uint)!bVar4;
}

Assistant:

ssl_open_record_t dtls1_open_change_cipher_spec(SSL *ssl, size_t *out_consumed,
                                                uint8_t *out_alert,
                                                Span<uint8_t> in) {
  if (!ssl->d1->has_change_cipher_spec) {
    // dtls1_open_handshake processes both handshake and ChangeCipherSpec.
    auto ret = dtls1_open_handshake(ssl, out_consumed, out_alert, in);
    if (ret != ssl_open_record_success) {
      return ret;
    }
  }
  if (ssl->d1->has_change_cipher_spec) {
    ssl->d1->has_change_cipher_spec = false;
    return ssl_open_record_success;
  }
  return ssl_open_record_discard;
}